

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O3

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDep
          (SDGDependenciesBuilder *this,DepDGElement *elem,Value *on)

{
  SystemDependenceGraph *pSVar1;
  DepDGElement *pDVar2;
  DepDGElement *pDVar3;
  _Rb_tree_node_base *p_Var4;
  SystemDependenceGraph *pSVar5;
  SystemDependenceGraph *pSVar6;
  DepDGElement *pDVar7;
  DepDGElement *local_38;
  
  pSVar1 = this->_sdg;
  if ((on == (Value *)0x0) || (on[0x10] != (Value)0x15)) {
    pSVar6 = *(SystemDependenceGraph **)(pSVar1 + 0xa0);
    pSVar1 = pSVar1 + 0x98;
    do {
      if (*(Value **)(pSVar6 + 0x20) >= on) {
        pSVar1 = pSVar6;
      }
      pSVar6 = *(SystemDependenceGraph **)
                (pSVar6 + (ulong)(*(Value **)(pSVar6 + 0x20) < on) * 8 + 0x10);
    } while (pSVar6 != (SystemDependenceGraph *)0x0);
    pDVar7 = (DepDGElement *)0x0;
    if (1 < *(int *)&(*(DepDGElement **)(pSVar1 + 0x28))->field_0xc) {
      pDVar7 = *(DepDGElement **)(pSVar1 + 0x28);
    }
    if (pDVar7 != (DepDGElement *)0x0 && *(int *)&pDVar7->field_0xc == 6) {
      pDVar2 = (DepDGElement *)
               pDVar7[1]._use_deps.super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t.
               _M_impl.super__Rb_tree_header._M_node_count;
      if (pDVar2 == (DepDGElement *)0x0) {
        pDVar2 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
      }
      local_38 = pDVar2;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&elem->_control_deps,&local_38);
      local_38 = elem;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&pDVar2->_rev_control_deps,&local_38);
      p_Var4 = *(_Rb_tree_node_base **)
                &pDVar7[1]._use_deps.super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t.
                 _M_impl.super__Rb_tree_header._M_header;
      if (p_Var4 == (_Rb_tree_node_base *)&pDVar7[1].field_0x10) {
        return;
      }
      do {
        pDVar3 = *(DepDGElement **)(*(long *)(p_Var4 + 1) + 0x18);
        if (pDVar3 == (DepDGElement *)0x0) {
          pDVar3 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
        }
        local_38 = pDVar3;
        std::
        _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
        ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                  ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                    *)&pDVar2->_control_deps,&local_38);
        local_38 = pDVar2;
        std::
        _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
        ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                  ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                    *)&pDVar3->_rev_control_deps,&local_38);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != (_Rb_tree_node_base *)&pDVar7[1].field_0x10);
      return;
    }
  }
  else {
    pSVar6 = *(SystemDependenceGraph **)(pSVar1 + 0x130);
    if (pSVar6 != (SystemDependenceGraph *)0x0) {
      pSVar5 = pSVar1 + 0x128;
      do {
        if (*(Value **)(pSVar6 + 0x20) >= on) {
          pSVar5 = pSVar6;
        }
        pSVar6 = *(SystemDependenceGraph **)
                  (pSVar6 + (ulong)(*(Value **)(pSVar6 + 0x20) < on) * 8 + 0x10);
      } while (pSVar6 != (SystemDependenceGraph *)0x0);
      if ((pSVar5 != pSVar1 + 0x128) && (*(Value **)(pSVar5 + 0x20) <= on)) {
        pDVar7 = *(DepDGElement **)(pSVar5 + 0x28);
        goto LAB_00108681;
      }
    }
    pDVar7 = (DepDGElement *)0x0;
  }
LAB_00108681:
  local_38 = pDVar7;
  std::
  _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
  ::_M_insert_unique<dg::sdg::DepDGElement*const&>
            ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              *)&elem->_control_deps,&local_38);
  local_38 = elem;
  std::
  _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
  ::_M_insert_unique<dg::sdg::DepDGElement*const&>
            ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
              *)&pDVar7->_rev_control_deps,&local_38);
  return;
}

Assistant:

void addControlDep(sdg::DepDGElement *elem, const llvm::Value *on) {
        if (const auto *depB = llvm::dyn_cast<llvm::BasicBlock>(on)) {
            auto *depblock = _sdg.getBBlock(depB);
            assert(depblock && "Do not have the block");
            elem->addControlDep(*depblock);
        } else {
            auto *depnd = sdg::DepDGElement::get(_sdg.getNode(on));
            assert(depnd && "Do not have the node");

            if (auto *C = sdg::DGNodeCall::get(depnd)) {
                // this is 'noret' dependence (we have no other control deps for
                // calls)
                auto *noret = C->getParameters().getNoReturn();
                if (!noret)
                    noret = &C->getParameters().createNoReturn();
                elem->addControlDep(*noret);

                // add CD to all formal norets
                for (auto *calledF : C->getCallees()) {
                    auto *fnoret = calledF->getParameters().getNoReturn();
                    if (!fnoret)
                        fnoret = &calledF->getParameters().createNoReturn();
                    noret->addControlDep(*fnoret);
                }
            } else {
                elem->addControlDep(*depnd);
            }
        }
    }